

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

double __thiscall
BayesianGameForDecPOMDPStage::ComputeImmediateReward
          (BayesianGameForDecPOMDPStage *this,Index jtI,Index jaI)

{
  pointer ppJVar1;
  JointBeliefInterface *pJVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  char cVar4;
  undefined4 uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  BeliefIteratorGeneric bit;
  undefined **local_38;
  long *local_30;
  ulong local_28;
  ulong local_20;
  
  ppJVar1 = (this->_m_JBs).
            super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)jtI <
      (ulong)((long)(this->_m_JBs).
                    super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar1 >> 3)) {
    pJVar2 = ppJVar1[jtI];
    if (pJVar2 == (JointBeliefInterface *)0x0) {
      dVar6 = 0.0;
    }
    else {
      (**(code **)(*(long *)((long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8)) + 0x98))
                (&local_38,(long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8));
      auVar7 = ZEXT816(0);
      do {
        auVar8._0_8_ = auVar7._0_8_;
        uVar5 = (**(code **)(*local_30 + 0x18))();
        local_20 = (**(code **)(*local_30 + 0x10))();
        pDVar3 = this->_m_pu->_m_DecPOMDP;
        local_28 = (**(code **)(*(long *)pDVar3 + 0xc0))(pDVar3,uVar5,jaI);
        cVar4 = (**(code **)(*local_30 + 0x20))();
        auVar8._8_8_ = 0;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_28;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_20;
        auVar7 = vfmadd231sd_fma(auVar8,auVar9,auVar7);
        dVar6 = auVar7._0_8_;
      } while (cVar4 != '\0');
      local_38 = &PTR__BeliefIteratorGeneric_0059cb30;
      if (local_30 != (long *)0x0) {
        (**(code **)(*local_30 + 8))();
      }
    }
    return dVar6;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

double BayesianGameForDecPOMDPStage::
ComputeImmediateReward(Index jtI, Index jaI) const
{
    //Index jaohI = _m_jaohReps.at(jtI);
    JointBeliefInterface* jb = _m_JBs.at(jtI);
    double r = 0.0;
    if(jb)
    {    
        BeliefIteratorGeneric bit = jb->GetIterator();
        do{
            Index s = bit.GetStateIndex();
            double p = bit.GetProbability();
            r += p * _m_pu->GetReward(s, jaI);
        }while (bit.Next() );
    }
    return r;
    
}